

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::ClearEncoderErrorCount(AmpIO *this,uint index)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = this->NumEncoders;
  if (index == 0x10) {
    bVar2 = true;
    if ((ulong)uVar1 != 0) {
      memset(this->encErrorCount,0,(ulong)uVar1 << 2);
    }
  }
  else if (index < uVar1) {
    this->encErrorCount[index] = 0;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AmpIO::ClearEncoderErrorCount(unsigned int index)
{
    bool ret = true;
    if (index == MAX_CHANNELS) {
        // Clear all counters
        for (unsigned int i = 0; i < NumEncoders; i++)
            encErrorCount[i] = 0;
    }
    else if (index < NumEncoders) {
        encErrorCount[index] = 0;
    }
    else {
        ret = false;
    }
    return ret;
}